

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_krp.c
# Opt level: O1

void beltKRPStart(void *state,octet *key,size_t len,octet *level)

{
  u32From((u32 *)((long)state + 0x2c),level,0xc);
  *(size_t *)((long)state + 0x20) = len;
  beltKeyExpand2((u32 *)state,key,len);
  return;
}

Assistant:

void beltKRPStart(void* state, const octet key[], size_t len, 
	const octet level[12])
{
	belt_krp_st* st = (belt_krp_st*)state;
	ASSERT(memIsDisjoint2(level, 12, state, beltKRP_keep()));
	// block <- ... || level || ...
	u32From(st->block + 1, level, 12);
	// сохранить ключ
	beltKeyExpand2(st->key, key, st->len = len);
}